

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0041(ParserTester *this)

{
  ParseOptions parseOpts;
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  ParseOptions local_218;
  allocator<psy::C::SyntaxKind> local_1f7;
  SyntaxKind local_1f6 [3];
  iterator local_1f0;
  size_type local_1e8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1e0;
  Expectation local_1c8;
  Expectation local_110;
  allocator<char> local_41;
  string local_40;
  code *local_20;
  offset_in_DeclarationBinderTester_to_subr x;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_20 = DeclarationBinderTester::case1016;
  x = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"x ;",&local_41);
  Expectation::Expectation(&local_1c8);
  local_1f6[0] = STARTof_Node;
  local_1f6[1] = 0x3ee;
  local_1f6[2] = 0x412;
  local_1f0 = local_1f6;
  local_1e8 = 3;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1f7);
  __l._M_len = local_1e8;
  __l._M_array = local_1f0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1e0,__l,&local_1f7);
  pEVar1 = Expectation::AST(&local_1c8,&local_1e0);
  Expectation::Expectation(&local_110,pEVar1);
  ParseOptions::ParseOptions(&local_218);
  parseOpts.langExts_.translations_.field_0 = local_218.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_218.langDialect_.std_;
  parseOpts._1_7_ = local_218._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_218.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_218.field_2;
  parseOpts._26_6_ = local_218._26_6_;
  parse(this,&local_40,&local_110,Any,parseOpts);
  Expectation::~Expectation(&local_110);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1e0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1f7);
  Expectation::~Expectation(&local_1c8);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void ParserTester::case0041()
{
    CROSS_REFERENCE_TEST(DeclarationBinderTester::case1016);

    parse("x ;",
          Expectation()
              .AST({ SyntaxKind::TranslationUnit,
                     SyntaxKind::VariableAndOrFunctionDeclaration,
                     SyntaxKind::IdentifierDeclarator }));
}